

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged
          (QSortFilterProxyModelPrivate *this,Orientation orientation,int start,int end)

{
  int *piVar1;
  int _t2;
  QObject *this_00;
  Span *pSVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int _t3;
  int iVar10;
  long in_FS_OFFSET;
  const_iterator cVar11;
  QArrayData *local_58;
  int *piStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58 = (QArrayData *)0xffffffffffffffff;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  cVar11 = create_mapping(this,(QModelIndex *)&local_58);
  pSVar2 = (cVar11.i.d)->spans;
  uVar7 = cVar11.i.bucket >> 7;
  lVar6 = *(long *)(pSVar2[uVar7].entries[pSVar2[uVar7].offsets[(uint)cVar11.i.bucket & 0x7f]].
                    storage.data + 0x18);
  local_58 = (QArrayData *)0x0;
  piStack_50 = (int *)0x0;
  tStack_48.ptr = (QAbstractItemModel *)0x0;
  QList<int>::reserve((QList<int> *)&local_58,(long)((end - start) + 1));
  lVar8 = lVar6 + 0x30;
  if (orientation != Vertical) {
    lVar8 = lVar6 + 0x48;
  }
  lVar6 = *(long *)(lVar8 + 8);
  if ((long)start * 4 + lVar6 != (long)end * 4 + 4 + lVar6) {
    lVar8 = (long)start << 2;
    do {
      if (*(int *)(lVar6 + lVar8) != -1) {
        local_3c = *(int *)(lVar6 + lVar8);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_58,(qsizetype)tStack_48.ptr,&local_3c);
        QList<int>::end((QList<int> *)&local_58);
      }
      lVar8 = lVar8 + 4;
    } while ((long)end * 4 + 4 != lVar8);
  }
  iVar4 = QList<int>::begin((QList<int> *)&local_58);
  iVar5 = QList<int>::end((QList<int> *)&local_58);
  if (iVar4.i != iVar5.i) {
    uVar7 = (long)iVar5.i - (long)iVar4.i >> 2;
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i);
  }
  iVar10 = (int)tStack_48.ptr;
  iVar9 = 0;
  do {
    if (iVar10 <= iVar9) {
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,4,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    _t2 = piStack_50[iVar9];
    _t3 = _t2;
    iVar3 = iVar9 + 1;
    if (iVar9 + 1 < iVar10) {
      lVar6 = (long)iVar9 + 1;
      _t3 = (_t2 + iVar10 + -1) - iVar9;
      iVar9 = _t2;
      do {
        piVar1 = piStack_50 + lVar6;
        if (*piVar1 != iVar9 + 1) {
          _t3 = iVar9;
          iVar3 = (int)lVar6;
          break;
        }
        lVar6 = lVar6 + 1;
        iVar9 = *piVar1;
        iVar3 = iVar10;
      } while (lVar6 < iVar10);
    }
    iVar9 = iVar3;
    QAbstractItemModel::headerDataChanged((QAbstractItemModel *)this_00,orientation,_t2,_t3);
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceHeaderDataChanged(Qt::Orientation orientation,
                                                           int start, int end)
{
    Q_ASSERT(start <= end);

    Q_Q(QSortFilterProxyModel);
    Mapping *m = create_mapping(QModelIndex()).value();

    const QList<int> &source_to_proxy = (orientation == Qt::Vertical) ? m->proxy_rows : m->proxy_columns;

    QList<int> proxy_positions;
    proxy_positions.reserve(end - start + 1);
    {
        Q_ASSERT(source_to_proxy.size() > end);
        QList<int>::const_iterator it = source_to_proxy.constBegin() + start;
        const QList<int>::const_iterator endIt = source_to_proxy.constBegin() + end + 1;
        for ( ; it != endIt; ++it) {
            if (*it != -1)
                proxy_positions.push_back(*it);
        }
    }

    std::sort(proxy_positions.begin(), proxy_positions.end());

    int last_index = 0;
    const int numItems = proxy_positions.size();
    while (last_index < numItems) {
        const int proxyStart = proxy_positions.at(last_index);
        int proxyEnd = proxyStart;
        ++last_index;
        for (int i = last_index; i < numItems; ++i) {
            if (proxy_positions.at(i) == proxyEnd + 1) {
                ++last_index;
                ++proxyEnd;
            } else {
                break;
            }
        }
        emit q->headerDataChanged(orientation, proxyStart, proxyEnd);
    }
}